

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::GetProperty_Internal<false>
               (Var instance,RecyclableObject *propertyObject,bool isRoot,PropertyId propertyId,
               Var *value,ScriptContext *requestContext,PropertyValueInfo *info)

{
  long *plVar1;
  code *pcVar2;
  Var cacheInstance;
  bool bVar3;
  char cVar4;
  int iVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  PropertyRecord *pPVar8;
  RecyclableObject *pRVar9;
  RecyclableObject *pRVar10;
  undefined7 in_register_00000011;
  DynamicObject *dynamicObject;
  Var local_48;
  Var property;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000011,isRoot);
  bVar3 = TaggedNumber::Is(instance);
  if (bVar3) {
    PropertyValueInfo::ClearCacheInfo(info);
  }
  bVar3 = true;
  property = propertyObject;
  if ((char)local_34 != '\0') {
    if ((((propertyObject->type).ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x755,"(VarIs<RootObjectBase>(object))",
                                  "VarIs<RootObjectBase>(object)");
      if (!bVar3) goto LAB_009acea9;
      *puVar7 = 0;
    }
    propertyObject = (RecyclableObject *)property;
    iVar5 = (**(code **)(*property + 0x360))(property,instance,propertyId,value,info,requestContext)
    ;
    bVar3 = iVar5 == 0;
  }
  while (bVar3) {
    if (((propertyObject->type).ptr)->typeId == TypeIds_Null) {
LAB_009ace1e:
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01450888,MissingPropertyCachePhase);
      if (bVar3) {
        ScriptContext::RecordMissingPropertyMiss(requestContext);
      }
      bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,MissingPropertyCachePhase);
      cacheInstance = property;
      if (bVar3) {
        Output::Print(L"MissingPropertyCaching: Missing property %d on slow path.\n",
                      (ulong)(uint)propertyId);
      }
      TryCacheMissingProperty
                (instance,cacheInstance,(bool)(char)local_34,propertyId,requestContext,info);
      pRVar10 = ScriptContext::GetMissingPropertyResult(requestContext);
      *value = pRVar10;
      return 0;
    }
    iVar5 = (*(propertyObject->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x12])
                      (propertyObject,instance,(ulong)(uint)propertyId,value,info,requestContext);
    if (iVar5 != 0) {
      if (iVar5 != 1) goto LAB_009ace1e;
      break;
    }
    BVar6 = RecyclableObject::SkipsPrototype(propertyObject);
    if (BVar6 != 0) goto LAB_009ace1e;
    propertyObject = GetPrototypeNoTrap(propertyObject);
    bVar3 = true;
  }
  bVar3 = DynamicObject::IsBaseDynamicObject(propertyObject);
  if (bVar3) {
    plVar1 = *(long **)((propertyObject->type).ptr + 1);
    pPVar8 = ScriptContext::GetPropertyName(requestContext,propertyId);
    cVar4 = (**(code **)(*plVar1 + 0x2e0))(plVar1,pPVar8,&local_48,requestContext);
    if ((value != (Var *)0x0) && (cVar4 != '\0')) {
      bVar3 = VarIs<Js::RecyclableObject>(local_48);
      if (bVar3) {
        pRVar10 = VarTo<Js::RecyclableObject>(local_48);
        pRVar9 = VarTo<Js::RecyclableObject>(*value);
        if ((((((pRVar9->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr !=
            (((((pRVar10->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr) goto LAB_009acdcc;
      }
      if (*value != local_48) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x789,"(skipAssert || value == nullptr || *value == property)",
                                    "skipAssert || value == nullptr || *value == property");
        if (!bVar3) {
LAB_009acea9:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  }
LAB_009acdcc:
  if (((value != (Var *)0x0) &&
      ((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
       != (UndeclaredBlockVariable *)*value)) &&
     (bVar3 = VarIsImpl<Js::UnscopablesWrapperObject>(propertyObject), !bVar3)) {
    CacheOperators::CachePropertyRead
              (property,propertyObject,(bool)(char)local_34,propertyId,false,info,requestContext);
  }
  return 1;
}

Assistant:

BOOL JavascriptOperators::GetProperty_Internal(Var instance, RecyclableObject* propertyObject, const bool isRoot, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo* info)
    {
        if (TaggedNumber::Is(instance))
        {
            PropertyValueInfo::ClearCacheInfo(info);
        }
        RecyclableObject* object = propertyObject;
        BOOL foundProperty = FALSE;
        if (isRoot)
        {
            Assert(VarIs<RootObjectBase>(object));

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(object);
            foundProperty = rootObject->GetRootProperty(instance, propertyId, value, info, requestContext);
        }

        while (!foundProperty && !JavascriptOperators::IsNull(object))
        {
            if (unscopables && IsPropertyUnscopable(object, propertyId))
            {
                break;
            }
            else
            {
                PropertyQueryFlags result = object->GetPropertyQuery(instance, propertyId, value, info, requestContext);
                if (result != PropertyQueryFlags::Property_NotFound)
                {
                    foundProperty = JavascriptConversion::PropertyQueryFlagsToBoolean(result);
                    break;
                }
            }

            if (object->SkipsPrototype())
            {
                break;
            }

            object = JavascriptOperators::GetPrototypeNoTrap(object);
        }

        if (foundProperty)
        {
#if ENABLE_FIXED_FIELDS && DBG
            if (DynamicObject::IsBaseDynamicObject(object))
            {
                DynamicObject* dynamicObject = (DynamicObject*)object;
                DynamicTypeHandler* dynamicTypeHandler = dynamicObject->GetDynamicType()->GetTypeHandler();
                Var property;
                if (dynamicTypeHandler->CheckFixedProperty(requestContext->GetPropertyName(propertyId), &property, requestContext))
                {
                    bool skipAssert = false;
                    if (value != nullptr && Js::VarIs<Js::RecyclableObject>(property))
                    {
                        Js::RecyclableObject* pObject = Js::VarTo<Js::RecyclableObject>(property);
                        Js::RecyclableObject* pValue = Js::VarTo<Js::RecyclableObject>(*value);

                        if (pValue->GetScriptContext() != pObject->GetScriptContext())
                        {
                            // value was marshaled. skip check
                            skipAssert = true;
                        }
                    }
                    Assert(skipAssert || value == nullptr || *value == property);
                }
            }
#endif
            // Don't cache the information if the value is undecl block var
            // REVIEW: We might want to only check this if we need to (For LdRootFld or ScopedLdFld)
            //         Also we might want to throw here instead of checking it again in the caller
            if (value && !requestContext->IsUndeclBlockVar(*value) && !VarIs<UnscopablesWrapperObject>(object))
            {
                CacheOperators::CachePropertyRead(propertyObject, object, isRoot, propertyId, false, info, requestContext);
            }
#ifdef TELEMETRY_JSO
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful: */true);
            }
#endif

            return TRUE;
        }

        else
        {
#ifdef MISSING_PROPERTY_STATS
            if (PHASE_STATS1(MissingPropertyCachePhase))
            {
                requestContext->RecordMissingPropertyMiss();
            }
#endif
            if (PHASE_TRACE1(MissingPropertyCachePhase))
            {
                Output::Print(_u("MissingPropertyCaching: Missing property %d on slow path.\n"), propertyId);
            }

            TryCacheMissingProperty(instance, propertyObject, isRoot, propertyId, requestContext, info);

#if defined(TELEMETRY_JSO) || defined(TELEMETRY_AddToCache) // enabled for `TELEMETRY_AddToCache`, because this is the property-not-found codepath where the normal TELEMETRY_AddToCache code wouldn't be executed.
            if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
            {
                if (info && info->AllowResizingPolymorphicInlineCache()) // If in interpreted mode, not JIT.
                {
                    requestContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, nullptr);
                }
            }
#endif
            *value = requestContext->GetMissingPropertyResult();
            return FALSE;
        }
    }